

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::Pseudo>::copyAppend
          (QGenericArrayOps<QCss::Pseudo> *this,Pseudo *b,Pseudo *e)

{
  qsizetype *pqVar1;
  Pseudo *pPVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pPVar2 = (this->super_QArrayDataPointer<QCss::Pseudo>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::Pseudo>).size;
      pPVar2[lVar3].type = b->type;
      pDVar4 = (b->name).d.d;
      pPVar2[lVar3].name.d.d = pDVar4;
      pPVar2[lVar3].name.d.ptr = (b->name).d.ptr;
      pPVar2[lVar3].name.d.size = (b->name).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->function).d.d;
      pPVar2[lVar3].function.d.d = pDVar4;
      pPVar2[lVar3].function.d.ptr = (b->function).d.ptr;
      pPVar2[lVar3].function.d.size = (b->function).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pPVar2[lVar3].negated = b->negated;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::Pseudo>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }